

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O0

void Fxu_ListDoubleAddPairFirst(Fxu_Double *pDiv,Fxu_Pair *pLink)

{
  Fxu_ListPair *pFVar1;
  Fxu_ListPair *pList;
  Fxu_Pair *pLink_local;
  Fxu_Double *pDiv_local;
  
  pFVar1 = &pDiv->lPairs;
  if (pFVar1->pHead == (Fxu_Pair *)0x0) {
    pFVar1->pHead = pLink;
    (pDiv->lPairs).pTail = pLink;
    pLink->pDPrev = (Fxu_Pair *)0x0;
    pLink->pDNext = (Fxu_Pair *)0x0;
  }
  else {
    pLink->pDPrev = (Fxu_Pair *)0x0;
    pFVar1->pHead->pDPrev = pLink;
    pLink->pDNext = pFVar1->pHead;
    pFVar1->pHead = pLink;
  }
  (pDiv->lPairs).nItems = (pDiv->lPairs).nItems + 1;
  return;
}

Assistant:

void Fxu_ListDoubleAddPairFirst( Fxu_Double * pDiv, Fxu_Pair * pLink )
{
    Fxu_ListPair * pList = &pDiv->lPairs;
    if ( pList->pHead == NULL )
    {
        pList->pHead = pLink;
        pList->pTail = pLink;
        pLink->pDPrev = NULL;
        pLink->pDNext = NULL;
    }
    else
    {
        pLink->pDPrev = NULL;
        pList->pHead->pDPrev = pLink;
        pLink->pDNext = pList->pHead;
        pList->pHead = pLink;
    }
    pList->nItems++;
}